

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int> *map,Var *max)

{
  uint uVar1;
  bool bVar2;
  Var VVar3;
  anon_struct_8_10_eb538618_for_header aVar4;
  char *pcVar5;
  ulong uVar6;
  
  bVar2 = satisfied(this,c);
  if (bVar2) {
    return;
  }
  aVar4 = c->header;
  if ((ulong)aVar4 >> 0x22 != 0) {
    uVar6 = 0;
    do {
      uVar1 = *(uint *)(&c[1].header.field_0x0 + uVar6 * 4);
      if (((byte)uVar1 & 1 ^ (this->assigns).data[(int)uVar1 >> 1].value) != 1) {
        pcVar5 = "-";
        if ((uVar1 & 1) == 0) {
          pcVar5 = "";
        }
        VVar3 = mapVar((int)uVar1 >> 1,map,max);
        fprintf((FILE *)f,"%s%d ",pcVar5,(ulong)(VVar3 + 1));
        aVar4 = c->header;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)aVar4 >> 0x22);
  }
  fwrite("0\n",2,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, Clause &c, vec<Var> &map, Var &max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False) fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max) + 1);
    fprintf(f, "0\n");
}